

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::anon_unknown_77::AsyncPipe::BlockedPumpTo::abortRead(BlockedPumpTo *this)

{
  PromiseFulfiller<unsigned_long> *pPVar1;
  AsyncPipe *this_00;
  char *pcVar2;
  size_t sVar3;
  char (*in_RCX) [29];
  StringPtr cancelReason;
  String local_198;
  Exception local_178;
  
  cancelReason.content.size_ = 0x17;
  cancelReason.content.ptr = "abortRead() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  pPVar1 = this->fulfiller;
  kj::_::Debug::makeDescription<char_const(&)[29]>
            (&local_198,(Debug *)"\"read end of pipe was aborted\"","read end of pipe was aborted",
             in_RCX);
  Exception::Exception
            (&local_178,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,800,&local_198);
  (*pPVar1->_vptr_PromiseFulfiller[1])(pPVar1,&local_178);
  Exception::~Exception(&local_178);
  sVar3 = local_198.content.size_;
  pcVar2 = local_198.content.ptr;
  if (local_198.content.ptr != (char *)0x0) {
    local_198.content.ptr = (char *)0x0;
    local_198.content.size_ = 0;
    (**(local_198.content.disposer)->_vptr_ArrayDisposer)
              (local_198.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  this_00 = this->pipe;
  if ((BlockedPumpTo *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncIoStream *)0x0;
  }
  AsyncPipe::abortRead(this_00);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");
      fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
      pipe.endState(*this);
      pipe.abortRead();
    }